

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3_vmprintf(char *zFormat,__va_list_tag *ap)

{
  int iVar1;
  long in_FS_OFFSET;
  char *z;
  StrAccum acc;
  char zBase [70];
  __va_list_tag *in_stack_00000288;
  char *in_stack_00000290;
  sqlite3_str *in_stack_00000298;
  StrAccum *in_stack_ffffffffffffff58;
  char *local_80;
  undefined1 local_78 [24];
  undefined1 *local_60;
  char local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_58,0xaa,0x46);
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    sqlite3StrAccumInit((StrAccum *)local_78,(sqlite3 *)0x0,local_58,0x46,1000000000);
    sqlite3_str_vappendf(in_stack_00000298,in_stack_00000290,in_stack_00000288);
    local_80 = sqlite3StrAccumFinish(in_stack_ffffffffffffff58);
  }
  else {
    local_80 = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_80;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_API char *sqlite3_vmprintf(const char *zFormat, va_list ap){
  char *z;
  char zBase[SQLITE_PRINT_BUF_SIZE];
  StrAccum acc;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( zFormat==0 ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
#ifndef SQLITE_OMIT_AUTOINIT
  if( sqlite3_initialize() ) return 0;
#endif
  sqlite3StrAccumInit(&acc, 0, zBase, sizeof(zBase), SQLITE_MAX_LENGTH);
  sqlite3_str_vappendf(&acc, zFormat, ap);
  z = sqlite3StrAccumFinish(&acc);
  return z;
}